

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_sys.c
# Opt level: O0

c_int init_linsys_solver(LinSysSolver **s,csc *P,csc *A,c_float sigma,c_float *rho_vec,
                        linsys_solver_type linsys_solver,c_int polish)

{
  c_int cVar1;
  c_int in_RDI;
  int in_R8D;
  c_float unaff_retaddr;
  undefined4 in_stack_00000010;
  c_int in_stack_00000040;
  c_float *in_stack_00000048;
  c_float in_stack_00000050;
  csc *in_stack_00000058;
  csc *in_stack_00000060;
  pardiso_solver **in_stack_00000068;
  c_float *in_stack_fffffffffffffff8;
  
  if (in_R8D == 0) {
    cVar1 = init_linsys_solver_qdldl
                      ((qdldl_solver **)rho_vec,(csc *)CONCAT44(linsys_solver,in_stack_00000010),
                       (csc *)polish,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  }
  else if (in_R8D == 1) {
    cVar1 = init_linsys_solver_pardiso
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                       in_stack_00000048,in_stack_00000040);
  }
  else {
    cVar1 = init_linsys_solver_qdldl
                      ((qdldl_solver **)rho_vec,(csc *)CONCAT44(linsys_solver,in_stack_00000010),
                       (csc *)polish,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  }
  return cVar1;
}

Assistant:

c_int init_linsys_solver(LinSysSolver          **s,
                         const csc              *P,
                         const csc              *A,
                         c_float                 sigma,
                         const c_float          *rho_vec,
                         enum linsys_solver_type linsys_solver,
                         c_int                   polish) {
  switch (linsys_solver) {
  case QDLDL_SOLVER:
    return init_linsys_solver_qdldl((qdldl_solver **)s, P, A, sigma, rho_vec, polish);

# ifdef ENABLE_MKL_PARDISO
  case MKL_PARDISO_SOLVER:
    return init_linsys_solver_pardiso((pardiso_solver **)s, P, A, sigma, rho_vec, polish);

# endif /* ifdef ENABLE_MKL_PARDISO */
  default: // QDLDL
    return init_linsys_solver_qdldl((qdldl_solver **)s, P, A, sigma, rho_vec, polish);
  }
}